

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O2

void prepare_weights_for_2x2_convolve
               (float *layer_config_weights,int off,int cstep,__m256 *shuffle_weight,
               __m256i *weight_mask)

{
  __m256 afVar1;
  float *pfVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  float weight [4];
  
  weight = (float  [4])(ZEXT816(0) << 0x40);
  auVar5 = ZEXT1664((undefined1  [16])weight);
  pfVar2 = layer_config_weights + off;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    auVar5 = ZEXT464((uint)*pfVar2);
    weight[lVar3] = *pfVar2;
    pfVar2 = pfVar2 + cstep;
  }
  auVar4._16_16_ = auVar5._16_16_;
  auVar4._0_4_ = weight[0];
  auVar4._4_4_ = weight[1];
  auVar4._8_4_ = weight[2];
  auVar4._12_4_ = weight[3];
  afVar1 = (__m256)vpermps_avx2((undefined1  [32])*weight_mask,auVar4);
  *shuffle_weight = afVar1;
  afVar1 = (__m256)vpermps_avx2((undefined1  [32])weight_mask[1],auVar4);
  shuffle_weight[1] = afVar1;
  return;
}

Assistant:

static inline void prepare_weights_for_2x2_convolve(
    const float *layer_config_weights, int off, const int cstep,
    __m256 *shuffle_weight, __m256i *weight_mask) {
  // Weights needed for 2x2 block.
  float weight[4] = { 0 };
  for (int i = 0; i < 4; ++i) {
    weight[i] = layer_config_weights[off];
    off += cstep;
  }

  const __m256 weight_vec = _mm256_castps128_ps256(_mm_loadu_ps(weight));
  shuffle_weight[0] = _mm256_permutevar8x32_ps(weight_vec, weight_mask[0]);
  shuffle_weight[1] = _mm256_permutevar8x32_ps(weight_vec, weight_mask[1]);
}